

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_coin_selection.cpp
# Opt level: O2

void __thiscall
CoinSelection_SelectCoins_Simple_KnapsackSolver_ApproximateBestSubset_Test::TestBody
          (CoinSelection_SelectCoins_Simple_KnapsackSolver_ApproximateBestSubset_Test *this)

{
  bool bVar1;
  char *pcVar2;
  CoinSelectionOption *in_R9;
  Amount AVar3;
  bool use_bnb;
  AssertionResult gtest_ar_;
  _Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_> local_f8;
  AssertHelper local_e0;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> ret;
  AssertionResult gtest_ar;
  ConfidentialAssetId local_80;
  Amount local_50;
  Amount local_40;
  Amount fee;
  Amount select_value;
  
  AVar3 = cfd::core::Amount::CreateBySatoshiAmount(220000000);
  local_40.amount_ = AVar3.amount_;
  local_40.ignore_check_ = AVar3.ignore_check_;
  cfd::core::Amount::Amount(&select_value);
  cfd::core::Amount::Amount(&fee);
  AVar3 = cfd::core::Amount::CreateBySatoshiAmount(0x5dc);
  local_50.amount_ = AVar3.amount_;
  local_50.ignore_check_ = AVar3.ignore_check_;
  use_bnb = false;
  ret.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  ret.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  ret.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      GetBitcoinUtxoList();
      GetBitcoinOption();
      in_R9 = (CoinSelectionOption *)&gtest_ar;
      cfd::CoinSelection::SelectCoins
                ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)&gtest_ar_,&exp_selection,
                 &local_40,(vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)&local_f8,&exp_filter,
                 in_R9,&local_50,&select_value,&fee,&use_bnb);
      std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::_M_move_assign(&ret,&gtest_ar_);
      std::_Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~_Vector_base
                ((_Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)&gtest_ar_);
      cfd::core::ConfidentialAssetId::~ConfidentialAssetId(&local_80);
      std::_Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~_Vector_base(&local_f8);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0xe6,
               "Expected: ret = exp_selection.SelectCoins( target_amount, GetBitcoinUtxoList(), exp_filter, GetBitcoinOption(), tx_fee, &select_value, &fee, &use_bnb) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  gtest_ar_._0_8_ =
       ((long)ret.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
              super__Vector_impl_data._M_finish -
       (long)ret.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
             super__Vector_impl_data._M_start) / 0xd8;
  local_f8._M_impl.super__Vector_impl_data._M_start._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar,"ret.size()","2",(unsigned_long *)&gtest_ar_,(int *)&local_f8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0xe8,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f8,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_._0_8_ = cfd::core::Amount::GetSatoshiValue(&select_value);
  local_f8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0xdf84758;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar,"select_value.GetSatoshiValue()","234375000",(long *)&gtest_ar_,
             (int *)&local_f8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0xe9,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f8,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_._0_8_ = cfd::core::Amount::GetSatoshiValue(&fee);
  local_f8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0xe10;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar,"fee.GetSatoshiValue()","3600",(long *)&gtest_ar_,
             (int *)&local_f8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0xea,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f8,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  if ((long)ret.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)ret.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
            super__Vector_impl_data._M_start == 0x1b0) {
    gtest_ar_.success_ = true;
    gtest_ar_._1_7_ = 0x9502f;
    testing::internal::CmpHelperEQ<unsigned_long,long>
              ((internal *)&gtest_ar,"ret[0].amount","static_cast<int64_t>(156250000)",
               &(ret.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
                 super__Vector_impl_data._M_start)->amount,(long *)&gtest_ar_);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
                 ,0xec,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_f8,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f8);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    gtest_ar_.success_ = true;
    gtest_ar_._1_7_ = 0x4a817;
    testing::internal::CmpHelperEQ<unsigned_long,long>
              ((internal *)&gtest_ar,"ret[1].amount","static_cast<int64_t>(78125000)",
               &ret.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
                super__Vector_impl_data._M_start[1].amount,(long *)&gtest_ar_);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
                 ,0xed,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_f8,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f8);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
  }
  gtest_ar_._0_8_ = CONCAT71(gtest_ar_._1_7_,use_bnb) ^ 1;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (use_bnb != false) {
    testing::Message::Message((Message *)&local_f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"use_bnb","true",
               "false",&in_R9->use_bnb_);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0xef,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_f8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::_Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~_Vector_base
            (&ret.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>);
  return;
}

Assistant:

TEST(CoinSelection, SelectCoins_Simple_KnapsackSolver_ApproximateBestSubset)
{
  Amount target_amount = Amount::CreateBySatoshiAmount(220000000);
  Amount select_value;
  Amount fee;
  Amount tx_fee = Amount::CreateBySatoshiAmount(1500);
  bool use_bnb = false;
  std::vector<Utxo> ret;
  EXPECT_NO_THROW(ret = exp_selection.SelectCoins(
      target_amount, GetBitcoinUtxoList(), exp_filter, GetBitcoinOption(),
      tx_fee, &select_value, &fee, &use_bnb));

  EXPECT_EQ(ret.size(), 2);
  EXPECT_EQ(select_value.GetSatoshiValue(), 234375000);
  EXPECT_EQ(fee.GetSatoshiValue(), 3600);
  if (ret.size() == 2) {
    EXPECT_EQ(ret[0].amount, static_cast<int64_t>(156250000));
    EXPECT_EQ(ret[1].amount, static_cast<int64_t>(78125000));
  }
  EXPECT_FALSE(use_bnb);
}